

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O3

void __thiscall w3Module::read_tables(w3Module *this,uint8_t **cursor)

{
  uint32_t uVar1;
  ulong __new_size;
  w3TableType wVar2;
  string local_48;
  
  uVar1 = ::read_varuint32(cursor,this->end);
  __new_size = (ulong)uVar1;
  printf("reading tables size:%lX\n",__new_size);
  if (uVar1 == 1) {
    std::vector<w3TableType,_std::allocator<w3TableType>_>::resize(&this->tables,__new_size);
  }
  else {
    StringFormat_abi_cxx11_(&local_48,"%lX",__new_size);
    AssertFailedFormat("size == 1",&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    std::vector<w3TableType,_std::allocator<w3TableType>_>::resize(&this->tables,__new_size);
    if (__new_size == 0) {
      return;
    }
  }
  do {
    wVar2 = read_tabletype(this,cursor);
    *(this->tables).super__Vector_base<w3TableType,_std::allocator<w3TableType>_>._M_impl.
     super__Vector_impl_data._M_start = wVar2;
    __new_size = __new_size - 1;
  } while (__new_size != 0);
  return;
}

Assistant:

void w3Module::read_tables (uint8_t** cursor)
{
    const size_t size = read_varuint32 (cursor);
    printf ("reading tables size:%" FORMAT_SIZE "X\n", size);
    AssertFormat (size == 1, ("%" FORMAT_SIZE "X", size));
    tables.resize (size);
    for (size_t i = 0; i < size; ++i)
        tables [0] = read_tabletype (cursor);
}